

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int pigpio_command(int fd,int command,int p1,int p2,int rl)

{
  ssize_t sVar1;
  cmdCmd_t cmd;
  
  cmd.field_3.p3 = 0;
  cmd.cmd = command;
  cmd.p1 = p1;
  cmd.p2 = p2;
  pthread_mutex_lock((pthread_mutex_t *)&command_mutex);
  sVar1 = send(fd,&cmd,0x10,0);
  if (sVar1 == 0x10) {
    sVar1 = recv(fd,&cmd,0x10,0x100);
    if (sVar1 == 0x10) {
      if (rl != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      cmd.field_3.p3 = 0xfffff82f;
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
    cmd.field_3.p3 = 0xfffff830;
  }
  return cmd.field_3.p3;
}

Assistant:

static int pigpio_command(int fd, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   pthread_mutex_lock(&command_mutex);

   if (send(fd, &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_send;
   }

   if (recv(fd, &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_recv;
   }

   if (rl) pthread_mutex_unlock(&command_mutex);

   return cmd.res;
}